

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O3

void __thiscall
LinearScan::FillBailOutOffset
          (LinearScan *this,int *offset,StackSym *stackSym,FillBailOutState *state,Instr *instr)

{
  uint uVar1;
  Type TVar2;
  Lifetime *lifetime;
  code *pcVar3;
  bool bVar4;
  uint32 uVar5;
  BailOutKind BVar6;
  SymID SVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  undefined4 *puVar11;
  anon_union_8_2_fd66ddfd_for_StackSym_35 aVar12;
  LinearScan *this_00;
  Type pSVar13;
  RegNum reg;
  
  if (*offset != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x498,"(*offset == 0)",
                       "Can\'t have two active lifetime for the same byte code register");
    if (!bVar4) goto LAB_00584426;
    *puVar11 = 0;
  }
  bVar4 = StackSym::IsConst(stackSym);
  if (bVar4) {
    aVar12.constantValue = StackSym::GetLiteralConstValue_PostGlobOpt(stackSym);
  }
  else {
    if ((*(uint *)&stackSym->field_0x18 & 0x40) == 0) {
      lifetime = *(Lifetime **)&(stackSym->scratch).globOpt;
      bVar4 = IR::Instr::HasLazyBailOut(instr);
      if (!bVar4) {
        if (lifetime != (Lifetime *)0x0) {
          uVar1 = lifetime->start;
          uVar5 = IR::Instr::GetNumber(instr);
          if (uVar1 < uVar5) {
            uVar5 = IR::Instr::GetNumber(instr);
            if (uVar5 <= lifetime->end) goto LAB_005841fb;
          }
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x4ab,
                           "(instr->HasLazyBailOut() || lifetime && lifetime->start < instr->GetNumber() && instr->GetNumber() <= lifetime->end)"
                           ,
                           "instr->HasLazyBailOut() || lifetime && lifetime->start < instr->GetNumber() && instr->GetNumber() <= lifetime->end"
                          );
        if (!bVar4) goto LAB_00584426;
        *puVar11 = 0;
      }
LAB_005841fb:
      BVar6 = IR::Instr::GetBailOutKind(instr);
      if (((BVar6 == BailOutOnException) && ((stackSym->field_0x19 & 0x10) == 0)) &&
         (this->currentRegion->exceptionObjectSym != stackSym)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x4b1,
                           "(stackSym->IsAllocated() || (stackSym == this->currentRegion->GetExceptionObjectSym()))"
                           ,
                           "stackSym->IsAllocated() || (stackSym == this->currentRegion->GetExceptionObjectSym())"
                          );
        if (!bVar4) goto LAB_00584426;
        *puVar11 = 0;
      }
      PrepareForUse(this,lifetime);
      bVar4 = IR::Instr::HasLazyBailOut(instr);
      if (bVar4) {
        this_00 = (LinearScan *)IR::Instr::GetBailOutInfo(instr);
        SVar7 = BailOutInfo::GetClearedUseOfDstId((BailOutInfo *)this_00);
        if (SVar7 != (stackSym->super_Sym).m_id) goto LAB_00584371;
        reg = RegRAX;
        instr = (Instr *)this_00;
LAB_00584416:
        iVar10 = SaveSymbolToReg((LinearScan *)instr,reg,state,stackSym);
      }
      else {
LAB_00584371:
        if ((lifetime->field_0x9c & 1) == 0) {
          BVar6 = IR::Instr::GetBailOutKind(instr);
          if ((BVar6 != BailOutOnException) || (this->currentRegion->exceptionObjectSym == stackSym)
             ) {
            reg = lifetime->reg;
            goto LAB_00584416;
          }
        }
        if (((stackSym->field_0x19 & 0x10) == 0) && ((lifetime->field_0x9c & 8) == 0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar11 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x4ca,"(stackSym->IsAllocated() || lifetime->isDeadStore)",
                             "stackSym->IsAllocated() || lifetime->isDeadStore");
          if (!bVar4) {
LAB_00584426:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar11 = 0;
        }
        iVar10 = stackSym->m_offset + -0x10;
      }
      goto LAB_00584360;
    }
    if ((*(uint *)&stackSym->field_0x18 & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x4a2,"(!stackSym->m_isSingleDef)","!stackSym->m_isSingleDef");
      if (!bVar4) goto LAB_00584426;
      *puVar11 = 0;
    }
    aVar12 = stackSym->field_5;
  }
  pSVar13 = (Type)new<Memory::ArenaAllocator>
                            (0x10,(state->constantList).
                                  super_SList<void_*,_Memory::ArenaAllocator,_RealCount>.allocator,
                             0x364470);
  ((anon_union_8_2_fd66ddfd_for_StackSym_35 *)(pSVar13 + 1))->constantValue = (size_t)aVar12;
  pSVar13->next =
       (state->constantList).super_SList<void_*,_Memory::ArenaAllocator,_RealCount>.
       super_SListBase<void_*,_Memory::ArenaAllocator,_RealCount>.
       super_SListNodeBase<Memory::ArenaAllocator>.next;
  (state->constantList).super_SList<void_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListBase<void_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar13;
  TVar2 = (state->constantList).super_SList<void_*,_Memory::ArenaAllocator,_RealCount>.
          super_SListBase<void_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount.count;
  (state->constantList).super_SList<void_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListBase<void_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount.count = TVar2 + 1;
  uVar8 = GetBailOutRegisterSaveSlotCount();
  uVar9 = GetBailOutReserveSlotCount();
  iVar10 = uVar9 + uVar8 + TVar2 + 1;
LAB_00584360:
  *offset = iVar10;
  return;
}

Assistant:

void
LinearScan::FillBailOutOffset(int * offset, StackSym * stackSym, FillBailOutState * state, IR::Instr * instr)
{
    AssertMsg(*offset == 0, "Can't have two active lifetime for the same byte code register");
    if (stackSym->IsConst())
    {
        state->constantList.Prepend(reinterpret_cast<Js::Var>(stackSym->GetLiteralConstValue_PostGlobOpt()));

        // Constant offset are offset by the number of register save slots
        *offset = state->constantList.Count() + GetBailOutRegisterSaveSlotCount() + GetBailOutReserveSlotCount();
    }
    else if (stackSym->m_isEncodedConstant)
    {
        Assert(!stackSym->m_isSingleDef);
        state->constantList.Prepend((Js::Var)stackSym->constantValue);

        // Constant offset are offset by the number of register save slots
        *offset = state->constantList.Count() + GetBailOutRegisterSaveSlotCount() + GetBailOutReserveSlotCount();
    }
    else
    {
        Lifetime * lifetime = stackSym->scratch.linearScan.lifetime;
        Assert(instr->HasLazyBailOut() || lifetime && lifetime->start < instr->GetNumber() && instr->GetNumber() <= lifetime->end);
        if (instr->GetBailOutKind() == IR::BailOutOnException)
        {
            // Apart from the exception object sym, lifetimes for all other syms that need to be restored at this bailout,
            // must have been spilled at least once (at the TryCatch, or at the Leave, or both)
            // Post spilling, a lifetime could have been second chance allocated. But, it should still have stack allocated for its sym
            Assert(stackSym->IsAllocated() || (stackSym == this->currentRegion->GetExceptionObjectSym()));
        }

        this->PrepareForUse(lifetime);

        if (instr->HasLazyBailOut() && instr->GetBailOutInfo()->GetClearedUseOfDstId() == stackSym->m_id)
        {
            // Force value of bytecode upward exposed destination symbol of a call instruction
            // with lazy bailout to be restored from `rax`
            // We clear the bit in bytecode upward exposed for destination symbol of a call
            // instructions with lazy bailout in globopt to get past the assert that the
            // register hasn't been initialized yet.
            // Now, since the value is actually in rax, during FillBailOutRecord,
            // we can always force the bailout to restore that symbol from rax.
#ifdef _M_X64
            *offset = this->SaveSymbolToReg(RegRAX, state, stackSym);
#elif _M_IX86
            *offset = this->SaveSymbolToReg(RegEAX, state, stackSym);
#else
            AssertMsg(false, "Lazy bailout for ARM is not yet supported");
#endif
        }
        else if (lifetime->isSpilled ||
            ((instr->GetBailOutKind() == IR::BailOutOnException) && (stackSym != this->currentRegion->GetExceptionObjectSym()))) // BailOutOnException must restore from memory
        {
            Assert(stackSym->IsAllocated() || lifetime->isDeadStore);
#ifdef MD_GROW_LOCALS_AREA_UP
            *offset = -((int)stackSym->m_offset + BailOutInfo::StackSymBias);
#else
            // Stack offset are negative, includes the PUSH EBP and return address
            *offset = stackSym->m_offset - (2 * MachPtr);
#endif
        }
        else
        {
            *offset = this->SaveSymbolToReg(lifetime->reg, state, stackSym);
        }
    }
}